

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

bool jessilib::equalsi<char32_t,char8_t>
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> lhs,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs)

{
  char32_t lhs_00;
  bool bVar1;
  jessilib *pjVar2;
  size_t sVar3;
  jessilib *extraout_RDX;
  jessilib *this;
  size_t sVar4;
  char8_t *pcVar5;
  decode_result dVar6;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  
  pcVar5 = rhs._M_str;
  pjVar2 = (jessilib *)rhs._M_len;
  sVar4 = 0;
  this = pjVar2;
  while( true ) {
    if ((lhs._M_len == sVar4) || (this == (jessilib *)0x0)) {
      return lhs._M_len == sVar4 && this == (jessilib *)0x0;
    }
    lhs_00 = lhs._M_str[sVar4];
    in_string._M_str = (char8_t *)pjVar2;
    in_string._M_len = (size_t)pcVar5;
    dVar6 = decode_codepoint_utf8<char8_t>(this,in_string);
    sVar3 = dVar6.units;
    if ((sVar3 == 0) || (bVar1 = equalsi(lhs_00,dVar6.codepoint), !bVar1)) break;
    pcVar5 = pcVar5 + sVar3;
    this = this + -sVar3;
    sVar4 = sVar4 + 1;
    pjVar2 = extraout_RDX;
  }
  return false;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}